

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O3

int testIO(char *filename)

{
  int iVar1;
  HPresolve *this;
  long *plVar2;
  undefined4 *puVar3;
  long lVar4;
  HModel model;
  HinOut h;
  HDual solver;
  undefined1 *apuStack_165c8 [2];
  undefined1 auStack_165b8 [16];
  undefined1 *apuStack_165a8 [2];
  undefined1 auStack_16598 [16];
  HModel aHStack_16588 [1552];
  int iStack_15f78;
  int iStack_15f70;
  HinOut aHStack_153f8 [1752];
  undefined8 auStack_14d20 [62];
  HDual HStack_14b30;
  
  HModel::HModel(aHStack_16588);
  apuStack_165a8[0] = auStack_16598;
  std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_165a8,"fileIO","");
  apuStack_165c8[0] = auStack_165b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)apuStack_165c8,"fileIO","");
  HinOut::HinOut(aHStack_153f8,apuStack_165a8,apuStack_165c8);
  if (apuStack_165c8[0] != auStack_165b8) {
    operator_delete(apuStack_165c8[0]);
  }
  if (apuStack_165a8[0] != auStack_16598) {
    operator_delete(apuStack_165a8[0]);
  }
  HinOut::HinOutTestRead(aHStack_153f8,aHStack_16588);
  if (iStack_15f78 == 0) {
    iVar1 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Empty problem",0xd);
    goto LAB_00106a2d;
  }
  this = (HPresolve *)operator_new(0xb18);
  HPresolve::HPresolve(this);
  HModel::copy_fromHModelToHPresolve((HPresolve *)aHStack_16588);
  iVar1 = HPresolve::presolve();
  if (iVar1 == 3) {
    HPresolve::postsolve();
    HModel::load_fromPostsolve((HPresolve *)aHStack_16588);
    lVar4 = 0x8a8;
    do {
      memset((void *)((long)&HStack_14b30.dual_variant + lVar4),0,0xa8);
      lVar4 = lVar4 + 0xb0;
    } while (lVar4 != 0x4d68);
    lVar4 = 0x4de8;
    do {
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 400) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x198) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x180) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x188) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x170) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x178) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d8) = 0;
      *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
      *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.TimeLimitValue + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.totalRebuildTime + lVar4) = 0;
      lVar4 = lVar4 + 0xb8;
    } while (lVar4 != 0x95c8);
    lVar4 = 0x9578;
    do {
      puVar3 = (undefined4 *)((long)&HStack_14b30.dual_variant + lVar4);
      *puVar3 = 0;
      *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
      *(undefined4 **)(&HStack_14b30.SolveBailout + lVar4) = puVar3;
      *(undefined4 **)((long)&HStack_14b30.TimeLimitValue + lVar4) = puVar3;
      *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.n_dvx_fwk + lVar4) = 0;
      *(undefined8 *)(&HStack_14b30.nw_dvx_fwk + lVar4) = 0;
      *(undefined8 *)
       ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar4) = 0;
      *(undefined8 *)
       ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar4 + 8) = 0;
      *(undefined8 *)
       ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + lVar4 + 0x10) = 0;
      *(undefined8 *)(&HStack_14b30.iz_DSE_wt + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.numTot + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.matrix + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.factor + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.jMove + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.workRange + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.baseLower + lVar4) = 0;
      lVar4 = lVar4 + 0xe8;
    } while (lVar4 != 0xf018);
    lVar4 = 0xf228;
    do {
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x20) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x28) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x10) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x18) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x40) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x48) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x50) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x58) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x60) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x68) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x80) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x88) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x90) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x98) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xa0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xa8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xb8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xc0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 200) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xd0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xd8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xe0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xf8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x100) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x108) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x110) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x118) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x120) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x158) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x160) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x148) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x150) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x138) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x140) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 400) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x198) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x180) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x188) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x170) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x178) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c8) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d0) = 0;
      *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d8) = 0;
      *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
      *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.TimeLimitValue + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.totalRebuildTime + lVar4) = 0;
      lVar4 = lVar4 + 0x260;
    } while (lVar4 != 0x13e28);
    lVar4 = 0x13c08;
    do {
      *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
      *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
      *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
      lVar4 = lVar4 + 0x78;
    } while (lVar4 != 0x14b08);
    HDual::solve((HModel *)&HStack_14b30,(int)aHStack_16588,0);
    HModel::util_reportSolverOutcome((char *)aHStack_16588);
LAB_001069bc:
    HDual::~HDual(&HStack_14b30);
  }
  else {
    if (iVar1 == 0) {
      HModel::load_fromPresolve((HPresolve *)aHStack_16588);
      lVar4 = 0x8a8;
      do {
        memset((void *)((long)&HStack_14b30.dual_variant + lVar4),0,0xa8);
        lVar4 = lVar4 + 0xb0;
      } while (lVar4 != 0x4d68);
      lVar4 = 0x4de8;
      do {
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 400) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x198) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x180) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x188) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x170) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x178) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d8) = 0;
        *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
        *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.TimeLimitValue + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.totalRebuildTime + lVar4) = 0;
        lVar4 = lVar4 + 0xb8;
      } while (lVar4 != 0x95c8);
      lVar4 = 0x9578;
      do {
        puVar3 = (undefined4 *)((long)&HStack_14b30.dual_variant + lVar4);
        *puVar3 = 0;
        *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
        *(undefined4 **)(&HStack_14b30.SolveBailout + lVar4) = puVar3;
        *(undefined4 **)((long)&HStack_14b30.TimeLimitValue + lVar4) = puVar3;
        *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.n_dvx_fwk + lVar4) = 0;
        *(undefined8 *)(&HStack_14b30.nw_dvx_fwk + lVar4) = 0;
        *(undefined8 *)
         ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data + lVar4) = 0;
        *(undefined8 *)
         ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data + lVar4 + 8) = 0;
        *(undefined8 *)
         ((long)&HStack_14b30.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data + lVar4 + 0x10) = 0;
        *(undefined8 *)(&HStack_14b30.iz_DSE_wt + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.numTot + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.matrix + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.factor + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.jMove + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.workRange + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.baseLower + lVar4) = 0;
        lVar4 = lVar4 + 0xe8;
      } while (lVar4 != 0xf018);
      lVar4 = 0xf228;
      do {
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x20) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x28) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x10) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x18) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x40) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x48) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x50) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x58) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x60) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x68) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x80) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x88) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x90) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x98) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xa0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xa8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xb8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xc0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 200) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xd0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xd8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xe0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0xf8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x100) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x108) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x110) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x118) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x120) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x158) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x160) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x148) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x150) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x138) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x140) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 400) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x198) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x180) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x188) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x170) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x178) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1b8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1c8) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d0) = 0;
        *(undefined8 *)((long)auStack_14d20 + lVar4 + 0x1d8) = 0;
        *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
        *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.TimeLimitValue + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.totalRebuilds + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.totalRebuildTime + lVar4) = 0;
        lVar4 = lVar4 + 0x260;
      } while (lVar4 != 0x13e28);
      lVar4 = 0x13c08;
      do {
        *(undefined8 *)((long)&HStack_14b30.dual_variant + lVar4) = 0;
        *(undefined8 *)((long)&HStack_14b30.Crash_Mode + lVar4) = 0;
        *(undefined8 *)(&HStack_14b30.SolveBailout + lVar4) = 0;
        lVar4 = lVar4 + 0x78;
      } while (lVar4 != 0x14b08);
      HDual::solve((HModel *)&HStack_14b30,(int)aHStack_16588,0);
      HPresolve::setProblemStatus((int)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," STATUS = ",10);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iStack_15f70);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      HModel::util_getPrimalDualValues
                ((vector *)aHStack_16588,(vector *)(this + 0xf0),(vector *)(this + 0x108),
                 (vector *)(this + 0x120));
      HModel::util_getBasicIndexNonbasicFlag((vector *)aHStack_16588,(vector *)(this + 600));
      HPresolve::postsolve();
      HModel::load_fromPostsolve((HPresolve *)aHStack_16588);
      HDual::solve((HModel *)&HStack_14b30,(int)aHStack_16588,0);
      HModel::util_reportSolverOutcome((char *)aHStack_16588);
      goto LAB_001069bc;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Status return from presolve: ",0x1d);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  HPresolve::~HPresolve(this);
  operator_delete(this);
  iVar1 = 0;
LAB_00106a2d:
  HinOut::~HinOut(aHStack_153f8);
  HModel::~HModel(aHStack_16588);
  return iVar1;
}

Assistant:

int testIO(const char *filename) {
//testIO solve the problem in file with presolve

	HModel model;

	HinOut h("fileIO", "fileIO");
	h.HinOutTestRead(model);

	// Check size
	if (model.numRow == 0) {
		cout<<"Empty problem";
		return 1;
	}
	else if (1) {
		HPresolve * pre = new HPresolve();
		model.copy_fromHModelToHPresolve(pre);
		int status = pre->presolve();

		if (!status) {
			//pre->reportTimes();
			model.load_fromPresolve(pre);
			HDual solver;
			solver.solve(&model);
			pre->setProblemStatus(model.getPrStatus());
			cout<<" STATUS = " << model.getPrStatus() <<endl;
			model.util_getPrimalDualValues(pre->colValue, pre->colDual, pre->rowValue, pre->rowDual);
			model.util_getBasicIndexNonbasicFlag(pre->basicIndex, pre->nonbasicFlag);
			pre->postsolve();
			model.load_fromPostsolve(pre);
			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else if (status == HPresolve::Empty) {
			pre->postsolve();
			model.load_fromPostsolve(pre);
			HDual solver;

			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else cout <<"Status return from presolve: "<< status<< endl;
		delete pre;
	}
	else {
	  HDual solver;
	  HPresolve * pre = new HPresolve();
	  model.copy_fromHModelToHPresolve(pre);
	  //pre->initializeVectors();
	  //pre->print(0);
	  model.initWithLogicalBasis();
	  solver.solve(&model);
	  model.util_reportSolverOutcome("testIO");
	}
	return 0;
}